

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

void my_numbox_save(t_gobj *z,_binbuf *b)

{
  _gobj *p_Var1;
  t_pd p_Var2;
  short sVar3;
  short sVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  t_symbol *ptVar13;
  t_symbol *ptVar14;
  t_symbol *ptVar15;
  double local_118;
  t_symbol *local_88;
  t_symbol *srl [3];
  t_symbol *local_68;
  t_symbol *bflcol [3];
  t_my_numbox *x;
  _binbuf *b_local;
  t_gobj *z_local;
  
  iemgui_save((t_iemgui *)z,&local_88,&local_68);
  if ((*(uint *)&z[0x44].g_pd >> 0x1b & 1) != 0) {
    *(uint *)&z[0x44].g_pd = *(uint *)&z[0x44].g_pd & 0xf7ffffff;
    sys_queuegui(z,(_glist *)z[3].g_pd,my_numbox_draw_update);
  }
  ptVar13 = gensym("#X");
  ptVar14 = gensym("obj");
  sVar3 = *(short *)&z[2].g_next;
  sVar4 = *(short *)((long)&z[2].g_next + 2);
  ptVar15 = gensym("nbx");
  uVar5 = *(undefined4 *)((long)&z[0x4e].g_pd + 4);
  iVar6 = *(int *)&z[4].g_pd;
  iVar7 = *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4);
  p_Var1 = z[0x4a].g_next;
  p_Var2 = z[0x4b].g_pd;
  uVar8 = *(undefined4 *)&z[0x4c].g_pd;
  iVar11 = iem_symargstoint((t_iem_init_symargs *)&z[0x44].g_next);
  uVar9 = *(undefined4 *)&z[5].g_pd;
  uVar10 = *(undefined4 *)((long)&z[5].g_pd + 4);
  iVar12 = iem_fstyletoint((t_iem_fstyle_flags *)(z + 0x44));
  if (((ulong)z[0x44].g_next & 1) == 0) {
    local_118 = 0.0;
  }
  else {
    local_118 = (double)*(float *)&z[0x4a].g_pd;
  }
  binbuf_addv(b,"ssiisiiffiisssiiiisssfi",(double)(float)(double)p_Var1,
              (double)(float)(double)p_Var2,local_118,ptVar13,ptVar14,(ulong)(uint)(int)sVar3,
              (ulong)(uint)(int)sVar4,ptVar15,uVar5,iVar6 / iVar7,uVar8,iVar11,local_88,srl[0],
              srl[1],uVar9,uVar10,iVar12,*(undefined4 *)((long)&z[0x44].g_pd + 4),local_68,bflcol[0]
              ,bflcol[1],*(undefined4 *)&z[0x4e].g_next);
  binbuf_addv(b,";");
  return;
}

Assistant:

static void my_numbox_save(t_gobj *z, t_binbuf *b)
{
    t_my_numbox *x = (t_my_numbox *)z;
    t_symbol *bflcol[3];
    t_symbol *srl[3];

    iemgui_save(&x->x_gui, srl, bflcol);
    if(x->x_gui.x_fsf.x_change)
    {
        x->x_gui.x_fsf.x_change = 0;
        sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
    }
    binbuf_addv(b, "ssiisiiffiisssiiiisssfi", gensym("#X"), gensym("obj"),
                (int)x->x_gui.x_obj.te_xpix, (int)x->x_gui.x_obj.te_ypix,
                gensym("nbx"), x->x_numwidth, x->x_gui.x_h/IEMGUI_ZOOM(x),
                (t_float)x->x_min, (t_float)x->x_max,
                x->x_lin0_log1, iem_symargstoint(&x->x_gui.x_isa),
                srl[0], srl[1], srl[2],
                x->x_gui.x_ldx, x->x_gui.x_ldy,
                iem_fstyletoint(&x->x_gui.x_fsf), x->x_gui.x_fontsize,
                bflcol[0], bflcol[1], bflcol[2],
                x->x_gui.x_isa.x_loadinit?x->x_val:0., x->x_log_height);
    binbuf_addv(b, ";");
}